

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O2

int8_t bf_get_int8(bfile_t *bfile)

{
  uint8_t uVar1;
  ulong uVar2;
  
  uVar2 = bfile->pos;
  if (uVar2 == bfile->size) {
    return '\0';
  }
  if (bfile->ipos == uVar2) {
    bf_read_buffer(bfile);
    uVar2 = bfile->pos;
  }
  uVar1 = bfile->buffer[(int)(uVar2 % (ulong)bfile->buffer_size)];
  bfile->pos = uVar2 + 1;
  return uVar1;
}

Assistant:

int8_t
bf_get_int8(
    bfile_t * bfile )
{
    int8_t val;
    int bufpos;

    assert( bfile != NULL );
    assert( (bfile->flags & BF_READABLE) != FALSE );

    if ( bf_at_eof( bfile ) != FALSE )
        return 0;

    if ( (bfile->ipos - bfile->pos) < 1 ) 
        bf_read_buffer( bfile );

    bufpos = bfile->pos % bfile->buffer_size;
    val =((int8_t *)(bfile->buffer))[bufpos];
    bfile->pos++;
    return val;
}